

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

char * unescapeString(char *str)

{
  char cVar1;
  char *local_20;
  char *dst;
  char *src;
  char *str_local;
  
  local_20 = str;
  for (dst = str; *dst != '\0'; dst = dst + 1) {
    if (*dst == '\\') {
      dst = dst + 1;
      cVar1 = *dst;
      if (cVar1 == 'n') {
        *local_20 = '\n';
      }
      else if (cVar1 == 'r') {
        *local_20 = '\r';
      }
      else if (cVar1 == 't') {
        *local_20 = '\t';
      }
      else {
        *local_20 = *dst;
      }
    }
    else if (dst != local_20) {
      *local_20 = *dst;
    }
    local_20 = local_20 + 1;
  }
  *local_20 = '\0';
  return str;
}

Assistant:

static inline char *unescapeString(char* str)
{
    char *src, *dst;
    src = str;
    dst = str;
    while(*src)
    {
        if(*src == '\\')
        {
            src++;
            switch(*src)
            {
            case 'n': *dst = '\n'; break;
            case 'r': *dst = '\r'; break;
            case 't': *dst = '\t'; break;
            default:  *dst = *src; break;
            }
        }
        else
        if(src != dst)
        {
            *dst = *src;
        }
        src++; dst++;
    }
    *dst = '\0';
    return str;
}